

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AS_DCP_internal.h
# Opt level: O3

TrackSet<ASDCP::MXF::TimecodeComponent> * __thiscall
ASDCP::MXF::CreateTrackAndSequence<ASDCP::MXF::SourcePackage,ASDCP::MXF::TimecodeComponent>
          (TrackSet<ASDCP::MXF::TimecodeComponent> *__return_storage_ptr__,MXF *this,
          OP1aHeader *Header,SourcePackage *Package,string *TrackName,Rational *clip_edit_rate,
          UL *Definition,ui32_t TrackID,Dictionary *Dict)

{
  undefined8 uVar1;
  Dictionary *d;
  undefined4 uVar2;
  Track *this_00;
  Sequence *this_01;
  undefined4 in_stack_00000014;
  UTF16String local_58;
  
  d = (Dictionary *)CONCAT44(in_stack_00000014,TrackID);
  __return_storage_ptr__->Track = (Track *)0x0;
  __return_storage_ptr__->Sequence = (Sequence *)0x0;
  __return_storage_ptr__->Clip = (TimecodeComponent *)0x0;
  this_00 = (Track *)operator_new(0x118);
  Track::Track(this_00,d);
  __return_storage_ptr__->Track = this_00;
  (**(code **)(*(long *)this + 0x68))(this,this_00);
  uVar2 = *(undefined4 *)((long)&TrackName->_M_string_length + 4);
  (this_00->EditRate).super_Rational.Numerator = *(undefined4 *)&TrackName->_M_string_length;
  (this_00->EditRate).super_Rational.Denominator = uVar2;
  std::vector<Kumu::UUID,_std::allocator<Kumu::UUID>_>::push_back
            ((vector<Kumu::UUID,_std::allocator<Kumu::UUID>_> *)&Header->field_0x138,
             &(this_00->super_GenericTrack).super_InterchangeObject.InstanceUID);
  (this_00->super_GenericTrack).TrackID = (ui32_t)Definition;
  UTF16String::UTF16String
            (&local_58,
             (char *)(Package->super_GenericPackage).super_InterchangeObject.super_KLVPacket.
                     _vptr_KLVPacket);
  std::__cxx11::string::_M_assign
            ((string *)&(this_00->super_GenericTrack).TrackName.m_property.super_string);
  (this_00->super_GenericTrack).TrackName.m_has_value = true;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58.super_string._M_dataplus._M_p != &local_58.super_string.field_2) {
    operator_delete(local_58.super_string._M_dataplus._M_p,
                    local_58.super_string.field_2._M_allocated_capacity + 1);
  }
  this_01 = (Sequence *)operator_new(0xf0);
  Sequence::Sequence(this_01,(Dictionary *)CONCAT44(in_stack_00000014,TrackID));
  __return_storage_ptr__->Sequence = this_01;
  (**(code **)(*(long *)this + 0x68))(this,this_01);
  (this_00->super_GenericTrack).Sequence.m_property.super_Identifier<16U>.m_HasValue =
       (this_01->super_StructuralComponent).super_InterchangeObject.InstanceUID.
       super_Identifier<16U>.m_HasValue;
  uVar1 = *(undefined8 *)
           ((this_01->super_StructuralComponent).super_InterchangeObject.InstanceUID.
            super_Identifier<16U>.m_Value + 8);
  *(undefined8 *)(this_00->super_GenericTrack).Sequence.m_property.super_Identifier<16U>.m_Value =
       *(undefined8 *)
        (this_01->super_StructuralComponent).super_InterchangeObject.InstanceUID.
        super_Identifier<16U>.m_Value;
  *(undefined8 *)
   ((this_00->super_GenericTrack).Sequence.m_property.super_Identifier<16U>.m_Value + 8) = uVar1;
  (this_00->super_GenericTrack).Sequence.m_has_value = true;
  (this_01->super_StructuralComponent).DataDefinition.super_Identifier<16U>.m_HasValue =
       SUB41((clip_edit_rate->super_Rational).Numerator,0);
  uVar1 = *(undefined8 *)((long)&clip_edit_rate[1].super_IArchive._vptr_IArchive + 1);
  *(undefined8 *)(this_01->super_StructuralComponent).DataDefinition.super_Identifier<16U>.m_Value =
       *(undefined8 *)((long)&(clip_edit_rate->super_Rational).Numerator + 1);
  *(undefined8 *)
   ((this_01->super_StructuralComponent).DataDefinition.super_Identifier<16U>.m_Value + 8) = uVar1;
  return __return_storage_ptr__;
}

Assistant:

TrackSet<ClipT>
	CreateTrackAndSequence(OP1aHeader& Header, PackageT& Package, const std::string TrackName,
			       const MXF::Rational& clip_edit_rate, const UL& Definition, ui32_t TrackID, const Dictionary *Dict)
	{
	  TrackSet<ClipT> NewTrack;

	  NewTrack.Track = new Track(Dict);
	  Header.AddChildObject(NewTrack.Track);
	  NewTrack.Track->EditRate = clip_edit_rate;
	  Package.Tracks.push_back(NewTrack.Track->InstanceUID);
	  NewTrack.Track->TrackID = TrackID;
	  NewTrack.Track->TrackName = TrackName.c_str();

	  NewTrack.Sequence = new Sequence(Dict);
	  Header.AddChildObject(NewTrack.Sequence);
	  NewTrack.Track->Sequence = NewTrack.Sequence->InstanceUID;
	  NewTrack.Sequence->DataDefinition = Definition;

	  return NewTrack;
	}